

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O1

DataBlobImpl * __thiscall
Diligent::MakeNewRCObj<Diligent::DataBlobImpl,Diligent::IMemoryAllocator>::operator()
          (MakeNewRCObj<Diligent::DataBlobImpl,Diligent::IMemoryAllocator> *this,
          vector<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
          *CtorArgs)

{
  undefined8 *puVar1;
  Char *pCVar2;
  Char *pCVar3;
  Int32 IVar4;
  undefined4 uVar5;
  RefCountersImpl *pRefCounters;
  RefCountersImpl *this_00;
  DataBlobImpl *pObject;
  
  if (*(long **)(this + 8) == (long *)0x0) {
    this_00 = (RefCountersImpl *)operator_new(0x30);
    (this_00->super_IReferenceCounters)._vptr_IReferenceCounters =
         (_func_int **)&PTR_AddStrongRef_0041f918;
    (this_00->m_ObjectState)._M_i = NotInitialized;
    this_00->m_ObjectWrapperBuffer[0] = 0;
    this_00->m_ObjectWrapperBuffer[1] = 0;
    this_00->m_ObjectWrapperBuffer[2] = 0;
    this_00->m_NumStrongReferences = (__atomic_base<int>)0x0;
    this_00->m_NumWeakReferences = (__atomic_base<int>)0x0;
    (this_00->m_Lock).m_IsLocked._M_base._M_i = false;
    pRefCounters = this_00;
  }
  else {
    pRefCounters = (RefCountersImpl *)(**(code **)(**(long **)(this + 8) + 0x18))();
    this_00 = (RefCountersImpl *)0x0;
  }
  puVar1 = *(undefined8 **)this;
  if (puVar1 == (undefined8 *)0x0) {
    pObject = (DataBlobImpl *)malloc(0x48);
  }
  else {
    pObject = (DataBlobImpl *)
              (**(code **)*puVar1)
                        (puVar1,0x48,*(undefined8 *)(this + 0x10),*(undefined8 *)(this + 0x18),
                         *(undefined4 *)(this + 0x20));
  }
  RefCountedObject<Diligent::IDataBlob>::RefCountedObject<>
            ((RefCountedObject<Diligent::IDataBlob> *)pObject,
             &pRefCounters->super_IReferenceCounters);
  (pObject->super_ObjectBase<Diligent::IDataBlob>).super_RefCountedObject<Diligent::IDataBlob>.
  super_IDataBlob.super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_004248b0;
  pCVar2 = (CtorArgs->
           super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
           )._M_impl.super__Tp_alloc_type.m_dvpDescription;
  pCVar3 = (CtorArgs->
           super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
           )._M_impl.super__Tp_alloc_type.m_dvpFileName;
  IVar4 = (CtorArgs->
          super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
          )._M_impl.super__Tp_alloc_type.m_dvpLineNumber;
  uVar5 = *(undefined4 *)
           &(CtorArgs->
            super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
            )._M_impl.super__Tp_alloc_type.field_0x1c;
  (pObject->m_DataBuff).
  super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Tp_alloc_type.m_Allocator =
       (CtorArgs->
       super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
       )._M_impl.super__Tp_alloc_type.m_Allocator;
  (pObject->m_DataBuff).
  super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Tp_alloc_type.m_dvpDescription = pCVar2;
  (pObject->m_DataBuff).
  super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Tp_alloc_type.m_dvpFileName = pCVar3;
  (pObject->m_DataBuff).
  super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Tp_alloc_type.m_dvpLineNumber = IVar4;
  *(undefined4 *)
   &(pObject->m_DataBuff).
    super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
    ._M_impl.super__Tp_alloc_type.field_0x1c = uVar5;
  (pObject->m_DataBuff).
  super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (CtorArgs->
       super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (pObject->m_DataBuff).
  super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (CtorArgs->
       super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (pObject->m_DataBuff).
  super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (CtorArgs->
       super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (CtorArgs->
  super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (CtorArgs->
  super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (CtorArgs->
  super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this_00 != (RefCountersImpl *)0x0) {
    RefCountersImpl::Attach<Diligent::DataBlobImpl,Diligent::IMemoryAllocator>
              (this_00,pObject,*(IMemoryAllocator **)this);
  }
  return pObject;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }